

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  pointer pcVar1;
  size_type sVar2;
  char *pcVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  string arg;
  cmOutputConverter converter;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar3 = GetCrossCompilingEmulator(this,c);
  pcVar1 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(pcVar3 == (char *)0x0) <
      (ulong)((long)*(pointer *)
                     ((long)&pcVar1[c].
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 8) -
              *(long *)&pcVar1[c].
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             >> 5)) {
    uVar6 = (uint)(pcVar3 == (char *)0x0);
    do {
      uVar6 = uVar6 + 1;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      if ((uVar6 == 1) &&
         (pcVar3 = GetArgv0Location(this,c), sVar2 = local_90._M_string_length,
         pcVar3 != (char *)0x0)) {
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)sVar2,(ulong)pcVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_90);
      }
      std::__cxx11::string::append((char *)cmd);
      if (this->OldStyle == true) {
        escapeForShellOldStyle(&local_70,&local_90);
        std::__cxx11::string::_M_append((char *)cmd,(ulong)local_70._M_dataplus._M_p);
        uVar4 = local_70.field_2._M_allocated_capacity;
        _Var5._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_00386202:
          operator_delete(_Var5._M_p,uVar4 + 1);
        }
      }
      else {
        cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_50,this->LG);
        cmOutputConverter::cmOutputConverter
                  ((cmOutputConverter *)&local_70,(cmStateSnapshot *)&local_50);
        cmOutputConverter::EscapeForShell
                  (&local_50,(cmOutputConverter *)&local_70,&local_90,this->MakeVars,false,false);
        std::__cxx11::string::_M_append((char *)cmd,(ulong)local_50._M_dataplus._M_p);
        uVar4 = local_50.field_2._M_allocated_capacity;
        _Var5._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00386202;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
    } while ((ulong)uVar6 <
             (ulong)((long)*(pointer *)
                            ((long)&pcVar1[c].
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&pcVar1[c].
                               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    >> 5));
  }
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  if (this->GetCrossCompilingEmulator(c) != CM_NULLPTR) {
    offset = 0;
  }
  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location =
          j == 0 ? this->GetArgv0Location(c) : CM_NULLPTR) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmOutputConverter converter(this->LG->GetStateSnapshot());
      cmd += converter.EscapeForShell(arg, this->MakeVars);
    }
  }
}